

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cpp
# Opt level: O0

void __thiscall CaDiCaL::Solver::disconnect_learner(Solver *this)

{
  State *pSVar1;
  Solver *in_RDI;
  char *in_stack_ffffffffffffffe8;
  
  require_solver_pointer_to_be_non_zero(in_RDI,in_stack_ffffffffffffffe8,(char *)0xe26223);
  if (in_RDI->external == (External *)0x0) {
    fatal_message_start();
    fprintf(_stderr,"invalid API usage of \'%s\' in \'%s\': ",
            "void CaDiCaL::Solver::disconnect_learner()",
            "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
           );
    fprintf(_stderr,"external solver not initialized");
    fputc(10,_stderr);
    fflush(_stderr);
    abort();
  }
  if (in_RDI->internal != (Internal *)0x0) {
    pSVar1 = state(in_RDI);
    if ((*pSVar1 & VALID) != 0) {
      in_RDI->external->learner = (Learner *)0x0;
      return;
    }
    fatal_message_start();
    fprintf(_stderr,"invalid API usage of \'%s\' in \'%s\': ",
            "void CaDiCaL::Solver::disconnect_learner()",
            "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
           );
    fprintf(_stderr,"solver in invalid state");
    fputc(10,_stderr);
    fflush(_stderr);
    abort();
  }
  fatal_message_start();
  fprintf(_stderr,"invalid API usage of \'%s\' in \'%s\': ",
          "void CaDiCaL::Solver::disconnect_learner()",
          "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
         );
  fprintf(_stderr,"internal solver not initialized");
  fputc(10,_stderr);
  fflush(_stderr);
  abort();
}

Assistant:

void Solver::disconnect_learner () {
  LOG_API_CALL_BEGIN ("disconnect_learner");
  REQUIRE_VALID_STATE ();
#ifdef LOGGING
  if (external->learner)
    LOG ("disconnecting previous learner");
  else
    LOG ("ignoring to disconnect learner (no previous one)");
#endif
  external->learner = 0;
  LOG_API_CALL_END ("disconnect_learner");
}